

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitTagDeclarationAsSpecifier
          (DeclarationBinder *this,TagDeclarationAsSpecifierSyntax *node)

{
  TagTypeSpecifierSyntax *this_00;
  Action AVar1;
  SyntaxKind SVar2;
  Identifier *pIVar3;
  Type *ty;
  ostream *poVar4;
  Action AVar5;
  SyntaxToken SStack_58;
  
  AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,(SyntaxNode *)node->tagDecl_);
  AVar5 = Quit;
  if (AVar1 != Quit) {
    this_00 = node->tagDecl_->typeSpec_;
    SVar2 = C::SyntaxNode::kind((SyntaxNode *)this_00);
    if (SVar2 == EnumTypeSpecifier) {
      TagTypeSpecifierSyntax::tagToken(&SStack_58,this_00);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Enum,pIVar3)->super_Type;
    }
    else if (SVar2 == UnionTypeSpecifier) {
      TagTypeSpecifierSyntax::tagToken(&SStack_58,this_00);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Union,pIVar3)->super_Type;
    }
    else {
      if (SVar2 != StructTypeSpecifier) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1e0);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,"<empty message>");
        std::endl<char,std::char_traits<char>>(poVar4);
        return Quit;
      }
      TagTypeSpecifierSyntax::tagToken(&SStack_58,this_00);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Struct,pIVar3)->super_Type;
    }
    SyntaxToken::~SyntaxToken(&SStack_58);
    pushType(this,ty);
    AVar5 = Skip;
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitTagDeclarationAsSpecifier(
        const TagDeclarationAsSpecifierSyntax* node)
{
    VISIT(node->tagDeclaration());

    const TagTypeSpecifierSyntax* tySpec = node->tagDeclaration()->typeSpecifier();
    TagType* tagTy = nullptr;
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::UnionTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::EnumTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Enum,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
    pushType(tagTy);

    return Action::Skip;
}